

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O1

bool btGjkEpaSolver2::Penetration
               (btConvexShape *shape0,btTransform *wtrs0,btConvexShape *shape1,btTransform *wtrs1,
               btVector3 *guess,sResults *results,bool usemargins)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _ _Var5;
  _ _Var6;
  code *pcVar7;
  long *plVar8;
  ulong uVar9;
  undefined8 uVar10;
  btScalar bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  tShape shape;
  GJK gjk;
  EPA epa;
  btVector3 local_3b18;
  tShape local_3b08;
  GJK local_3a78;
  EPA local_38a8;
  
  gjkepa2_impl::Initialize(shape0,wtrs0,shape1,wtrs1,results,&local_3b08,usemargins);
  local_3a78.m_nfree = 0;
  local_3a78.m_current = 0;
  local_3a78.m_ray.m_floats[0] = 0.0;
  local_3a78.m_ray.m_floats[1] = 0.0;
  local_3a78.m_ray.m_floats[2] = 0.0;
  local_3a78.m_ray.m_floats[3] = 0.0;
  local_3a78.m_status = Failed;
  local_3a78.m_distance = 0.0;
  uVar9 = *(ulong *)guess->m_floats ^ 0x8000000080000000;
  local_38a8.m_result.c[0]._0_4_ = -guess->m_floats[2];
  local_38a8.m_status = (btScalar)(int)uVar9;
  local_38a8._4_4_ = (btScalar)(int)(uVar9 >> 0x20);
  local_38a8.m_result.c[0]._4_4_ = 0.0;
  _Var5 = gjkepa2_impl::GJK::Evaluate(&local_3a78,&local_3b08,(btVector3 *)&local_38a8);
  if (_Var5 == Failed) {
    results->status = GJK_Failed;
  }
  else if (_Var5 == Inside) {
    local_38a8.m_hull.root = (sFace *)0x0;
    local_38a8.m_hull.count = 0;
    local_38a8.m_stock.root = (sFace *)0x0;
    local_38a8.m_stock.count = 0;
    gjkepa2_impl::EPA::Initialize(&local_38a8);
    bVar11 = -guess->m_floats[2];
    uVar9 = *(ulong *)guess->m_floats ^ 0x8000000080000000;
    local_3b18.m_floats[2] = bVar11;
    local_3b18.m_floats[0] = (btScalar)(int)uVar9;
    local_3b18.m_floats[1] = (btScalar)(int)(uVar9 >> 0x20);
    local_3b18.m_floats[3] = 0.0;
    _Var6 = gjkepa2_impl::EPA::Evaluate(&local_38a8,&local_3a78,&local_3b18);
    if (_Var6 == Failed) {
      results->status = EPA_Failed;
    }
    else {
      if (local_38a8.m_result.rank == 0) {
        fVar15 = 0.0;
        fVar13 = 0.0;
        fVar14 = 0.0;
      }
      else {
        fVar13 = 0.0;
        fVar14 = 0.0;
        fVar15 = 0.0;
        uVar9 = 0;
        do {
          plVar8 = (long *)((long)&(local_3b08.m_shapes[0]->super_btCollisionShape).
                                   _vptr_btCollisionShape + local_3b08._136_8_);
          pcVar7 = (code *)local_3b08.Ls;
          if ((local_3b08.Ls & 1) != 0) {
            pcVar7 = *(code **)(local_3b08.Ls + *plVar8 + -1);
          }
          uVar10 = (*pcVar7)(plVar8,*(undefined8 *)
                                     ((long)*(undefined1 (*) [16])&local_38a8 + uVar9 * 8 + 8));
          fVar1 = *(float *)((long)((undefined1 (*) [16])&local_38a8 + 2) + 8U + uVar9 * 4);
          fVar15 = fVar15 + fVar1 * (float)uVar10;
          fVar12 = (float)((ulong)uVar10 >> 0x20) * fVar1;
          fVar13 = fVar13 + fVar12;
          fVar14 = fVar14 + bVar11 * fVar1;
          uVar9 = uVar9 + 1;
          bVar11 = fVar12;
        } while (uVar9 < local_38a8.m_result.rank);
      }
      results->status = Penetrating;
      uVar10 = *(undefined8 *)(wtrs0->m_origin).m_floats;
      auVar2._4_4_ = (float)((ulong)uVar10 >> 0x20) +
                     (wtrs0->m_basis).m_el[1].m_floats[2] * fVar14 +
                     (wtrs0->m_basis).m_el[1].m_floats[0] * fVar15 +
                     (wtrs0->m_basis).m_el[1].m_floats[1] * fVar13;
      auVar2._0_4_ = (float)uVar10 +
                     (wtrs0->m_basis).m_el[0].m_floats[2] * fVar14 +
                     (wtrs0->m_basis).m_el[0].m_floats[0] * fVar15 +
                     (wtrs0->m_basis).m_el[0].m_floats[1] * fVar13;
      auVar2._8_4_ = (wtrs0->m_basis).m_el[2].m_floats[2] * fVar14 +
                     (wtrs0->m_basis).m_el[2].m_floats[0] * fVar15 +
                     (wtrs0->m_basis).m_el[2].m_floats[1] * fVar13 + (wtrs0->m_origin).m_floats[2];
      auVar2._12_4_ = 0;
      *(undefined1 (*) [16])results->witnesses[0].m_floats = auVar2;
      fVar14 = fVar14 - local_38a8.m_depth * local_38a8.m_normal.m_floats[2];
      uVar10 = *(undefined8 *)(wtrs0->m_origin).m_floats;
      fVar15 = fVar15 - local_38a8.m_normal.m_floats[0] * local_38a8.m_depth;
      fVar13 = fVar13 - local_38a8.m_normal.m_floats[1] * local_38a8.m_depth;
      auVar4._4_4_ = fVar15 * (wtrs0->m_basis).m_el[1].m_floats[0] +
                     fVar13 * (wtrs0->m_basis).m_el[1].m_floats[1] +
                     (wtrs0->m_basis).m_el[1].m_floats[2] * fVar14 + (float)((ulong)uVar10 >> 0x20);
      auVar4._0_4_ = fVar15 * (wtrs0->m_basis).m_el[0].m_floats[0] +
                     fVar13 * (wtrs0->m_basis).m_el[0].m_floats[1] +
                     (wtrs0->m_basis).m_el[0].m_floats[2] * fVar14 + (float)uVar10;
      auVar4._8_4_ = fVar14 * (wtrs0->m_basis).m_el[2].m_floats[2] +
                     (wtrs0->m_basis).m_el[2].m_floats[0] * fVar15 +
                     (wtrs0->m_basis).m_el[2].m_floats[1] * fVar13 + (wtrs0->m_origin).m_floats[2];
      auVar4._12_4_ = 0;
      *(undefined1 (*) [16])results->witnesses[1].m_floats = auVar4;
      auVar3._8_4_ = -local_38a8.m_normal.m_floats[2];
      auVar3._0_8_ = local_38a8.m_normal.m_floats._0_8_ ^ 0x8000000080000000;
      auVar3._12_4_ = 0;
      *(undefined1 (*) [16])(results->normal).m_floats = auVar3;
      results->distance = -local_38a8.m_depth;
    }
    if (_Var6 != Failed) {
      return true;
    }
  }
  return false;
}

Assistant:

bool	btGjkEpaSolver2::Penetration(	const btConvexShape*	shape0,
									 const btTransform&		wtrs0,
									 const btConvexShape*	shape1,
									 const btTransform&		wtrs1,
									 const btVector3&		guess,
									 sResults&				results,
									 bool					usemargins)
{
	tShape			shape;
	Initialize(shape0,wtrs0,shape1,wtrs1,results,shape,usemargins);
	GJK				gjk;	
	GJK::eStatus::_	gjk_status=gjk.Evaluate(shape,-guess);
	switch(gjk_status)
	{
	case	GJK::eStatus::Inside:
		{
			EPA				epa;
			EPA::eStatus::_	epa_status=epa.Evaluate(gjk,-guess);
			if(epa_status!=EPA::eStatus::Failed)
			{
				btVector3	w0=btVector3(0,0,0);
				for(U i=0;i<epa.m_result.rank;++i)
				{
					w0+=shape.Support(epa.m_result.c[i]->d,0)*epa.m_result.p[i];
				}
				results.status			=	sResults::Penetrating;
				results.witnesses[0]	=	wtrs0*w0;
				results.witnesses[1]	=	wtrs0*(w0-epa.m_normal*epa.m_depth);
				results.normal			=	-epa.m_normal;
				results.distance		=	-epa.m_depth;
				return(true);
			} else results.status=sResults::EPA_Failed;
		}
		break;
	case	GJK::eStatus::Failed:
		results.status=sResults::GJK_Failed;
		break;
		default:
					{
					}
	}
	return(false);
}